

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptorTables * google::protobuf::FileDescriptorTables::GetEmptyInstance(void)

{
  int iVar1;
  FileDescriptorTables *this;
  
  if (GetEmptyInstance()::file_descriptor_tables == '\0') {
    iVar1 = __cxa_guard_acquire(&GetEmptyInstance()::file_descriptor_tables);
    if (iVar1 != 0) {
      this = (FileDescriptorTables *)operator_new(200);
      FileDescriptorTables(this);
      GetEmptyInstance::file_descriptor_tables =
           internal::OnShutdownDelete<google::protobuf::FileDescriptorTables>(this);
      __cxa_guard_release(&GetEmptyInstance()::file_descriptor_tables);
    }
  }
  return GetEmptyInstance::file_descriptor_tables;
}

Assistant:

inline const FileDescriptorTables& FileDescriptorTables::GetEmptyInstance() {
  static auto file_descriptor_tables =
      internal::OnShutdownDelete(new FileDescriptorTables());
  return *file_descriptor_tables;
}